

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O2

void belt32BlockEncr(octet *block,u32 *key)

{
  uint uVar1;
  
  u32From((u32 *)block,block,0x18);
  beltBlockEncr3((u32 *)(block + 8),(u32 *)(block + 0xc),(u32 *)(block + 0x10),(u32 *)(block + 0x14)
                 ,key);
  uVar1 = *(uint *)(block + 8);
  *(uint *)(block + 8) = uVar1 ^ 1;
  *(uint *)block = *(uint *)block ^ uVar1 ^ 1;
  *(uint *)(block + 4) = *(uint *)(block + 4) ^ *(uint *)(block + 0xc);
  beltBlockEncr3((u32 *)(block + 0x10),(u32 *)(block + 0x14),(u32 *)block,(u32 *)(block + 4),key);
  uVar1 = *(uint *)(block + 0x10);
  *(uint *)(block + 0x10) = uVar1 ^ 2;
  *(uint *)(block + 8) = *(uint *)(block + 8) ^ uVar1 ^ 2;
  *(uint *)(block + 0xc) = *(uint *)(block + 0xc) ^ *(uint *)(block + 0x14);
  beltBlockEncr3((u32 *)block,(u32 *)(block + 4),(u32 *)(block + 8),(u32 *)(block + 0xc),key);
  uVar1 = *(uint *)block;
  *(uint *)block = uVar1 ^ 3;
  *(uint *)(block + 0x10) = *(uint *)(block + 0x10) ^ uVar1 ^ 3;
  *(uint *)(block + 0x14) = *(uint *)(block + 0x14) ^ *(uint *)(block + 4);
  u32To(block,0x18,(u32 *)block);
  return;
}

Assistant:

static void belt32BlockEncr(octet block[24], const u32 key[8])
{
	u32* t = (u32*)block;
	u32From(t, block, 24);
	// round #1
	beltBlockEncr3(t + 2, t + 3, t + 4, t + 5, key);
	t[2] ^= 1, t[0] ^= t[2], t[1] ^= t[3];
	// round #2
	beltBlockEncr3(t + 4, t + 5, t + 0, t + 1, key);
	t[4] ^= 2, t[2] ^= t[4], t[3] ^= t[5];
	// round #3
	beltBlockEncr3(t + 0, t + 1, t + 2, t + 3, key);
	t[0] ^= 3, t[4] ^= t[0], t[5] ^= t[1];
	// возврат
	u32To(block, 24, t);
}